

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O0

bool adiak::value<int>(string *name,int value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *type;
  adiak_value_t *val;
  char *name_00;
  char *subcategory_00;
  bool result;
  adiak_value_t *avalue;
  adiak_datatype_t *datatype;
  string *subcategory_local;
  int category_local;
  int value_local;
  string *name_local;
  
  subcategory_local._0_4_ = category;
  subcategory_local._4_4_ = value;
  _category_local = name;
  type = internal::parse<int>::make_type();
  if (type == (adiak_datatype_t *)0x0) {
    name_local._7_1_ = false;
  }
  else {
    val = (adiak_value_t *)malloc(8);
    bVar1 = internal::parse<int>::make_value((int *)((long)&subcategory_local + 4),val,type);
    if (bVar1) {
      name_00 = (char *)std::__cxx11::string::c_str();
      iVar2 = (int)subcategory_local;
      subcategory_00 = (char *)std::__cxx11::string::c_str();
      iVar2 = adiak_raw_namevalue(name_00,iVar2,subcategory_00,val,type);
      name_local._7_1_ = iVar2 == 0;
    }
    else {
      name_local._7_1_ = false;
    }
  }
  return name_local._7_1_;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }